

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O1

MainBuilder * __thiscall
kj::MainBuilder::callAfterParsing
          (MainBuilder *this,Function<kj::MainBuilder::Validity_()> *callback)

{
  bool bVar1;
  Impl *pIVar2;
  Fault f;
  DebugComparison<kj::Maybe<kj::Function<kj::MainBuilder::Validity_()>_>_&,_const_kj::None_&>
  _kjCondition;
  
  pIVar2 = (this->impl).ptr;
  _kjCondition.left = &pIVar2->finalCallback;
  bVar1 = (pIVar2->finalCallback).ptr.isSet;
  _kjCondition.result = (bool)(bVar1 ^ 1);
  _kjCondition.right = (None *)&kj::none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (bVar1 != false) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Function<kj::MainBuilder::Validity()>>&,kj::None_const&>&,char_const(&)[43]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/main.c++"
               ,0x179,FAILED,"impl->finalCallback == kj::none",
               "_kjCondition,\"callAfterParsing() can only be called once\"",&_kjCondition,
               (char (*) [43])"callAfterParsing() can only be called once");
    kj::_::Debug::Fault::fatal(&f);
  }
  f.exception._0_1_ = (pIVar2->subCommands)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
  if ((bool)f.exception._0_1_) {
    (pIVar2->finalCallback).ptr.field_1.value.impl.disposer = (callback->impl).disposer;
    (pIVar2->finalCallback).ptr.field_1.value.impl.ptr = (callback->impl).ptr;
    (callback->impl).ptr = (Iface *)0x0;
    (pIVar2->finalCallback).ptr.isSet = true;
    return this;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[57]>
            ((Fault *)&_kjCondition,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/main.c++"
             ,0x17a,FAILED,"impl->subCommands.empty()",
             "_kjCondition,\"cannot have a final callback when accepting sub-commands\"",
             (DebugExpression<bool> *)&f,
             (char (*) [57])"cannot have a final callback when accepting sub-commands");
  kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
}

Assistant:

Validity printVersion() {
    context.exitInfo(version);
    return true;
  }